

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,bool alreadyInsideBracedExpression)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  EndpointType endpointType;
  CompileMessage local_60;
  
  if (((int)CONCAT71(in_register_00000009,alreadyInsideBracedExpression) == 0) &&
     (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a351b), bVar1)) {
    while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a1eb4),
          !bVar1) {
      parseEndpoint(this,p,isInput,true);
    }
  }
  else {
    iVar2 = (*(p->super_ModuleBase).super_ASTObject._vptr_ASTObject[5])(p);
    if (((((char)iVar2 != '\0') &&
         (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3337), bVar1)) &&
        (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,"value"), !bVar1)) &&
       ((bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,"stream"), !bVar1 &&
        (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matches(&this->super_SOULTokeniser,"event"), !bVar1)))) {
      parseChildEndpoint(this,p,isInput);
      return;
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"value");
    endpointType = value;
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"stream");
      if (bVar1) {
        endpointType = stream;
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"event");
        if (bVar1) {
          endpointType = event;
        }
        else {
          Errors::expectedStreamType<>();
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
          CompileMessage::~CompileMessage(&local_60);
        }
      }
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a351b);
    if (bVar1) {
      while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                     ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a1eb4),
            !bVar1) {
        parseEndpoint(this,p,isInput,endpointType);
      }
    }
    else {
      parseEndpoint(this,p,isInput,endpointType);
    }
  }
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, bool alreadyInsideBracedExpression = false)
    {
        if (! alreadyInsideBracedExpression && matchIf (Operator::openBrace))
        {
            while (! matchIf (Operator::closeBrace))
                parseEndpoint (p, isInput, true);
        }
        else
        {
            if (p.isGraph() && matches (Token::identifier) && ! isNextTokenEndpointType (*this))
                return parseChildEndpoint (p, isInput);

            auto endpointType = parseEndpointType (*this);

            if (matchIf (Operator::openBrace))
            {
                while (! matchIf (Operator::closeBrace))
                    parseEndpoint (p, isInput, endpointType);
            }
            else
            {
                parseEndpoint (p, isInput, endpointType);
            }
        }
    }